

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::SchnorrSignature::GetData
          (ByteData *__return_storage_ptr__,SchnorrSignature *this,bool append_sighash_type)

{
  uint32_t uVar1;
  size_t sVar2;
  ByteData *in_stack_ffffffffffffff98;
  ByteData *this_00;
  ByteData *__return_storage_ptr___00;
  ByteData local_38;
  uint8_t local_1a;
  undefined1 local_19;
  uint8_t sighash_type;
  SchnorrSignature *pSStack_18;
  bool append_sighash_type_local;
  SchnorrSignature *this_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_19 = append_sighash_type;
  pSStack_18 = this;
  this_local = (SchnorrSignature *)__return_storage_ptr__;
  if (((append_sighash_type) &&
      (uVar1 = SigHashType::GetSigHashFlag(&this->sighash_type_), uVar1 != 0)) &&
     (sVar2 = ByteData::GetDataSize(&this->data_), sVar2 == 0x40)) {
    uVar1 = SigHashType::GetSigHashFlag(&this->sighash_type_);
    local_1a = (uint8_t)uVar1;
    this_00 = &local_38;
    ByteData::ByteData(this_00,local_1a);
    ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr___00,&this->data_,this_00);
    ByteData::~ByteData((ByteData *)0x48ca5d);
    return __return_storage_ptr__;
  }
  ByteData::ByteData(__return_storage_ptr___00,in_stack_ffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

ByteData SchnorrSignature::GetData(bool append_sighash_type) const {
  if ((!append_sighash_type) || (sighash_type_.GetSigHashFlag() == 0) ||
      (data_.GetDataSize() != SchnorrSignature::kSchnorrSignatureSize)) {
    return data_;
  }

  uint8_t sighash_type = static_cast<uint8_t>(sighash_type_.GetSigHashFlag());
  return data_.Concat(ByteData(sighash_type));
}